

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack4.h
# Opt level: O1

void ncnn::convdw5x5s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar51;
  int iVar52;
  int iVar53;
  void *pvVar54;
  void *pvVar55;
  void *pvVar56;
  void *pvVar57;
  undefined1 (*pauVar58) [16];
  void *pvVar59;
  long lVar60;
  int iVar61;
  long lVar62;
  int iVar63;
  void *pvVar64;
  long lVar65;
  void *pvVar66;
  long lVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  
  iVar51 = bottom_blob->c;
  if (0 < (long)iVar51) {
    iVar52 = top_blob->w;
    iVar53 = top_blob->h;
    pvVar54 = _bias->data;
    lVar62 = (long)((bottom_blob->w - iVar52) * 8);
    lVar60 = 0;
    do {
      if (pvVar54 == (void *)0x0) {
        fVar68 = 0.0;
        fVar69 = 0.0;
        fVar70 = 0.0;
        fVar71 = 0.0;
      }
      else {
        pfVar1 = (float *)((long)pvVar54 + lVar60 * 0x10);
        fVar68 = *pfVar1;
        fVar69 = pfVar1[1];
        fVar70 = pfVar1[2];
        fVar71 = pfVar1[3];
      }
      if (0 < iVar53) {
        pauVar58 = (undefined1 (*) [16])
                   (top_blob->cstep * lVar60 * top_blob->elemsize + (long)top_blob->data);
        lVar67 = kernel->w * lVar60 * kernel->elemsize;
        pvVar55 = kernel->data;
        pvVar64 = (void *)(bottom_blob->cstep * lVar60 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar65 = (long)bottom_blob->w * bottom_blob->elemsize;
        pvVar59 = (void *)((long)pvVar64 + lVar65 * 4);
        pvVar56 = (void *)(lVar65 * 3 + (long)pvVar64);
        pvVar57 = (void *)((long)pvVar64 + lVar65 * 2);
        pvVar66 = (void *)(lVar65 + (long)pvVar64);
        iVar63 = 0;
        do {
          if (0 < iVar52) {
            lVar65 = 0;
            iVar61 = iVar52;
            do {
              pfVar1 = (float *)((long)pvVar55 + lVar67);
              pfVar5 = (float *)((long)pvVar55 + lVar67 + 0x10);
              pfVar6 = (float *)((long)pvVar55 + lVar67 + 0x20);
              pfVar7 = (float *)((long)pvVar55 + lVar67 + 0x30);
              pfVar8 = (float *)((long)pvVar55 + lVar67 + 0x40);
              pfVar2 = (float *)((long)pvVar64 + lVar65);
              pfVar9 = (float *)((long)pvVar64 + lVar65 + 0x10);
              pfVar10 = (float *)((long)pvVar64 + lVar65 + 0x20);
              pfVar11 = (float *)((long)pvVar64 + lVar65 + 0x30);
              pfVar12 = (float *)((long)pvVar64 + lVar65 + 0x40);
              pfVar13 = (float *)((long)pvVar55 + lVar67 + 0x50);
              pfVar14 = (float *)((long)pvVar55 + lVar67 + 0x60);
              pfVar15 = (float *)((long)pvVar55 + lVar67 + 0x70);
              pfVar34 = (float *)((long)pvVar55 + lVar67 + 0x80);
              pfVar35 = (float *)((long)pvVar55 + lVar67 + 0x90);
              pfVar32 = (float *)((long)pvVar66 + lVar65);
              pfVar16 = (float *)((long)pvVar66 + lVar65 + 0x10);
              pfVar17 = (float *)((long)pvVar66 + lVar65 + 0x20);
              pfVar18 = (float *)((long)pvVar66 + lVar65 + 0x30);
              pfVar19 = (float *)((long)pvVar66 + lVar65 + 0x40);
              pfVar36 = (float *)((long)pvVar55 + lVar67 + 0xa0);
              pfVar37 = (float *)((long)pvVar55 + lVar67 + 0xb0);
              pfVar38 = (float *)((long)pvVar55 + lVar67 + 0xc0);
              pfVar39 = (float *)((long)pvVar55 + lVar67 + 0xd0);
              pfVar3 = (float *)((long)pvVar57 + lVar65);
              pfVar20 = (float *)((long)pvVar57 + lVar65 + 0x10);
              pfVar40 = (float *)((long)pvVar55 + lVar67 + 0xe0);
              pfVar21 = (float *)((long)pvVar57 + lVar65 + 0x20);
              pfVar22 = (float *)((long)pvVar57 + lVar65 + 0x30);
              pfVar23 = (float *)((long)pvVar57 + lVar65 + 0x40);
              pfVar41 = (float *)((long)pvVar55 + lVar67 + 0xf0);
              pfVar42 = (float *)((long)pvVar55 + lVar67 + 0x100);
              pfVar43 = (float *)((long)pvVar55 + lVar67 + 0x110);
              pfVar44 = (float *)((long)pvVar55 + lVar67 + 0x120);
              pfVar4 = (float *)((long)pvVar56 + lVar65);
              pfVar24 = (float *)((long)pvVar56 + lVar65 + 0x10);
              pfVar45 = (float *)((long)pvVar55 + lVar67 + 0x130);
              pfVar25 = (float *)((long)pvVar56 + lVar65 + 0x20);
              pfVar26 = (float *)((long)pvVar56 + lVar65 + 0x30);
              pfVar27 = (float *)((long)pvVar56 + lVar65 + 0x40);
              pfVar46 = (float *)((long)pvVar55 + lVar67 + 0x140);
              auVar47 = *(undefined1 (*) [16])((long)pvVar55 + lVar67 + 0x150);
              auVar48 = *(undefined1 (*) [16])((long)pvVar55 + lVar67 + 0x160);
              auVar49 = *(undefined1 (*) [16])((long)pvVar55 + lVar67 + 0x170);
              auVar50 = *(undefined1 (*) [16])((long)pvVar55 + lVar67 + 0x180);
              pfVar33 = (float *)((long)pvVar59 + lVar65);
              pfVar28 = (float *)((long)pvVar59 + lVar65 + 0x10);
              pfVar29 = (float *)((long)pvVar59 + lVar65 + 0x20);
              pfVar30 = (float *)((long)pvVar59 + lVar65 + 0x30);
              pfVar31 = (float *)((long)pvVar59 + lVar65 + 0x40);
              auVar72._0_4_ =
                   *pfVar1 * *pfVar2 + fVar68 + *pfVar5 * *pfVar9 + *pfVar6 * *pfVar10 +
                   *pfVar7 * *pfVar11 + *pfVar8 * *pfVar12 + *pfVar13 * *pfVar32 +
                   *pfVar14 * *pfVar16 + *pfVar15 * *pfVar17 + *pfVar34 * *pfVar18 +
                   *pfVar35 * *pfVar19 +
                   *pfVar36 * *pfVar3 + *pfVar37 * *pfVar20 + *pfVar38 * *pfVar21 +
                   *pfVar39 * *pfVar22 + *pfVar40 * *pfVar23 +
                   *pfVar41 * *pfVar4 + *pfVar42 * *pfVar24 + *pfVar43 * *pfVar25 +
                   *pfVar44 * *pfVar26 + *pfVar45 * *pfVar27 + *pfVar46 * *pfVar33 +
                   auVar47._0_4_ * *pfVar28 + auVar48._0_4_ * *pfVar29 + auVar49._0_4_ * *pfVar30 +
                   auVar50._0_4_ * *pfVar31;
              auVar72._4_4_ =
                   pfVar1[1] * pfVar2[1] + fVar69 + pfVar5[1] * pfVar9[1] + pfVar6[1] * pfVar10[1] +
                   pfVar7[1] * pfVar11[1] + pfVar8[1] * pfVar12[1] + pfVar13[1] * pfVar32[1] +
                   pfVar14[1] * pfVar16[1] + pfVar15[1] * pfVar17[1] + pfVar34[1] * pfVar18[1] +
                   pfVar35[1] * pfVar19[1] +
                   pfVar36[1] * pfVar3[1] + pfVar37[1] * pfVar20[1] + pfVar38[1] * pfVar21[1] +
                   pfVar39[1] * pfVar22[1] + pfVar40[1] * pfVar23[1] +
                   pfVar41[1] * pfVar4[1] + pfVar42[1] * pfVar24[1] + pfVar43[1] * pfVar25[1] +
                   pfVar44[1] * pfVar26[1] + pfVar45[1] * pfVar27[1] + pfVar46[1] * pfVar33[1] +
                   auVar47._4_4_ * pfVar28[1] + auVar48._4_4_ * pfVar29[1] +
                   auVar49._4_4_ * pfVar30[1] + auVar50._4_4_ * pfVar31[1];
              auVar72._8_4_ =
                   pfVar1[2] * pfVar2[2] + fVar70 + pfVar5[2] * pfVar9[2] + pfVar6[2] * pfVar10[2] +
                   pfVar7[2] * pfVar11[2] + pfVar8[2] * pfVar12[2] + pfVar13[2] * pfVar32[2] +
                   pfVar14[2] * pfVar16[2] + pfVar15[2] * pfVar17[2] + pfVar34[2] * pfVar18[2] +
                   pfVar35[2] * pfVar19[2] +
                   pfVar36[2] * pfVar3[2] + pfVar37[2] * pfVar20[2] + pfVar38[2] * pfVar21[2] +
                   pfVar39[2] * pfVar22[2] + pfVar40[2] * pfVar23[2] +
                   pfVar41[2] * pfVar4[2] + pfVar42[2] * pfVar24[2] + pfVar43[2] * pfVar25[2] +
                   pfVar44[2] * pfVar26[2] + pfVar45[2] * pfVar27[2] + pfVar46[2] * pfVar33[2] +
                   auVar47._8_4_ * pfVar28[2] + auVar48._8_4_ * pfVar29[2] +
                   auVar49._8_4_ * pfVar30[2] + auVar50._8_4_ * pfVar31[2];
              auVar72._12_4_ =
                   pfVar1[3] * pfVar2[3] + fVar71 + pfVar5[3] * pfVar9[3] + pfVar6[3] * pfVar10[3] +
                   pfVar7[3] * pfVar11[3] + pfVar8[3] * pfVar12[3] + pfVar13[3] * pfVar32[3] +
                   pfVar14[3] * pfVar16[3] + pfVar15[3] * pfVar17[3] + pfVar34[3] * pfVar18[3] +
                   pfVar35[3] * pfVar19[3] +
                   pfVar36[3] * pfVar3[3] + pfVar37[3] * pfVar20[3] + pfVar38[3] * pfVar21[3] +
                   pfVar39[3] * pfVar22[3] + pfVar40[3] * pfVar23[3] +
                   pfVar41[3] * pfVar4[3] + pfVar42[3] * pfVar24[3] + pfVar43[3] * pfVar25[3] +
                   pfVar44[3] * pfVar26[3] + pfVar45[3] * pfVar27[3] + pfVar46[3] * pfVar33[3] +
                   auVar47._12_4_ * pfVar28[3] + auVar48._12_4_ * pfVar29[3] +
                   auVar49._12_4_ * pfVar30[3] + auVar50._12_4_ * pfVar31[3];
              *pauVar58 = auVar72;
              pauVar58 = pauVar58 + 1;
              lVar65 = lVar65 + 0x20;
              iVar61 = iVar61 + -1;
            } while (iVar61 != 0);
            pvVar64 = (void *)((long)pvVar64 + lVar65);
            pvVar66 = (void *)((long)pvVar66 + lVar65);
            pvVar57 = (void *)((long)pvVar57 + lVar65);
            pvVar56 = (void *)((long)pvVar56 + lVar65);
            pvVar59 = (void *)((long)pvVar59 + lVar65);
          }
          pvVar64 = (void *)((long)pvVar64 + lVar62 * 4);
          pvVar66 = (void *)((long)pvVar66 + lVar62 * 4);
          pvVar57 = (void *)((long)pvVar57 + lVar62 * 4);
          pvVar56 = (void *)((long)pvVar56 + lVar62 * 4);
          pvVar59 = (void *)((long)pvVar59 + lVar62 * 4);
          iVar63 = iVar63 + 1;
        } while (iVar63 != iVar53);
      }
      lVar60 = lVar60 + 1;
    } while (lVar60 != iVar51);
  }
  return;
}

Assistant:

static void convdw5x5s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps(bias + g * 4) : _mm_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out;

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                __m128 _r04 = _mm_load_ps(r0 + 4 * 4);

                __m128 _k00 = _mm_load_ps(k0);
                __m128 _k01 = _mm_load_ps(k0 + 4);
                __m128 _k02 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k03 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k04 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k04, _r04, _sum0);

                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 4 * 2);
                __m128 _r13 = _mm_load_ps(r1 + 4 * 3);
                __m128 _r14 = _mm_load_ps(r1 + 4 * 4);

                __m128 _k10 = _mm_load_ps(k0);
                __m128 _k11 = _mm_load_ps(k0 + 4);
                __m128 _k12 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k13 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k14 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k14, _r14, _sum0);

                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 4 * 2);
                __m128 _r23 = _mm_load_ps(r2 + 4 * 3);
                __m128 _r24 = _mm_load_ps(r2 + 4 * 4);

                __m128 _k20 = _mm_load_ps(k0);
                __m128 _k21 = _mm_load_ps(k0 + 4);
                __m128 _k22 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k23 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k24 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k24, _r24, _sum0);

                __m128 _r30 = _mm_load_ps(r3);
                __m128 _r31 = _mm_load_ps(r3 + 4);
                __m128 _r32 = _mm_load_ps(r3 + 4 * 2);
                __m128 _r33 = _mm_load_ps(r3 + 4 * 3);
                __m128 _r34 = _mm_load_ps(r3 + 4 * 4);

                __m128 _k30 = _mm_load_ps(k0);
                __m128 _k31 = _mm_load_ps(k0 + 4);
                __m128 _k32 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k33 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k34 = _mm_load_ps(k0 + 4 * 4);
                k0 += 4 * 5;

                _sum0 = _mm_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k34, _r34, _sum0);

                __m128 _r40 = _mm_load_ps(r4);
                __m128 _r41 = _mm_load_ps(r4 + 4);
                __m128 _r42 = _mm_load_ps(r4 + 4 * 2);
                __m128 _r43 = _mm_load_ps(r4 + 4 * 3);
                __m128 _r44 = _mm_load_ps(r4 + 4 * 4);

                __m128 _k40 = _mm_load_ps(k0);
                __m128 _k41 = _mm_load_ps(k0 + 4);
                __m128 _k42 = _mm_load_ps(k0 + 4 * 2);
                __m128 _k43 = _mm_load_ps(k0 + 4 * 3);
                __m128 _k44 = _mm_load_ps(k0 + 4 * 4);
                k0 -= 4 * 20;

                _sum0 = _mm_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm_store_ps(outptr0, _sum0);

                outptr0 += 4;

                r0 += 4 * 2;
                r1 += 4 * 2;
                r2 += 4 * 2;
                r3 += 4 * 2;
                r4 += 4 * 2;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
            r3 += tailstep;
            r4 += tailstep;
        }
    }
}